

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinLength
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  Interpreter *this_00;
  pointer ppHVar2;
  RuntimeError *__return_storage_ptr__;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  fields;
  string local_48;
  
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 != 0x10) {
    __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&fields,"length takes 1 parameter.",(allocator<char> *)&local_48);
    Stack::makeError(__return_storage_ptr__,&this->stack,loc,(string *)&fields);
    __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
  }
  uVar3 = pVVar1->t - ARRAY;
  if (uVar3 < 4) {
    this_00 = (Interpreter *)(pVVar1->v).h;
    switch(pVVar1->t) {
    case ARRAY:
      ppHVar2 = (pointer)((long)(this_00->heap).entities.
                                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                                ._M_impl.super__Vector_impl_data._M_start -
                          *(long *)&(this_00->heap).lastMark >> 3);
      break;
    case FUNCTION:
      ppHVar2 = (pointer)(*(long *)&(this_00->stack).calls - (long)(this_00->stack)._vptr_Stack >> 4
                         );
      break;
    case OBJECT:
      objectFields(&fields,this_00,(HeapObject *)0x1,
                   (bool)((char)(&switchD_001bc740::switchdataD_00227b1c)[uVar3] + '\x1c'));
      auVar5._0_8_ = (double)CONCAT44(0x43300000,
                                      (int)fields._M_t._M_impl.super__Rb_tree_header._M_node_count);
      auVar5._8_4_ = (int)(fields._M_t._M_impl.super__Rb_tree_header._M_node_count >> 0x20);
      auVar5._12_4_ = 0x45300000;
      (this->scratch).t = NUMBER;
      (this->scratch).v.d =
           (auVar5._8_8_ - 1.9342813113834067e+25) + (auVar5._0_8_ - 4503599627370496.0);
      std::
      _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Rb_tree(&fields._M_t);
      return (AST *)0x0;
    case STRING:
      ppHVar2 = (this_00->heap).entities.
                super__Vector_base<jsonnet::internal::(anonymous_namespace)::HeapEntity_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapEntity_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    }
    auVar4._8_4_ = (int)((ulong)ppHVar2 >> 0x20);
    auVar4._0_8_ = ppHVar2;
    auVar4._12_4_ = 0x45300000;
    (this->scratch).t = NUMBER;
    (this->scratch).v.d =
         (auVar4._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)ppHVar2) - 4503599627370496.0);
    return (AST *)0x0;
  }
  auVar5 = __cxa_allocate_exception(0x38);
  (anonymous_namespace)::type_str_abi_cxx11_
            (&local_48,
             (_anonymous_namespace_ *)
             (args->
             super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
             )._M_impl.super__Vector_impl_data._M_start,auVar5._8_8_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fields,
                 "length operates on strings, objects, and arrays, got ",&local_48);
  Stack::makeError(auVar5._0_8_,&this->stack,loc,(string *)&fields);
  __cxa_throw(auVar5._0_8_,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

const AST *builtinLength(const LocationRange &loc, const std::vector<Value> &args)
    {
        if (args.size() != 1) {
            throw makeError(loc, "length takes 1 parameter.");
        }
        HeapEntity *e = args[0].v.h;
        switch (args[0].t) {
            case Value::OBJECT: {
                auto fields = objectFields(static_cast<HeapObject *>(e), true);
                scratch = makeNumber(fields.size());
            } break;

            case Value::ARRAY:
                scratch = makeNumber(static_cast<HeapArray *>(e)->elements.size());
                break;

            case Value::STRING:
                scratch = makeNumber(static_cast<HeapString *>(e)->value.length());
                break;

            case Value::FUNCTION:
                scratch = makeNumber(static_cast<HeapClosure *>(e)->params.size());
                break;

            default:
                throw makeError(loc,
                                "length operates on strings, objects, "
                                "and arrays, got " +
                                    type_str(args[0]));
        }
        return nullptr;
    }